

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mFILE.c
# Opt level: O1

char * mfload(FILE *fp,char *fn,size_t *size,int binary)

{
  byte bVar1;
  int iVar2;
  char *__ptr;
  size_t sVar3;
  ulong uVar4;
  ulong __size;
  long lVar5;
  stat sb;
  stat local_c0;
  
  bVar1 = 1;
  lVar5 = 0x2000;
  if (fn != (char *)0x0) {
    iVar2 = stat(fn,&local_c0);
    __size = local_c0.st_size;
    if (iVar2 != -1) {
      __ptr = (char *)malloc(local_c0.st_size);
      lVar5 = (long)(int)__size;
      bVar1 = 0;
      goto LAB_0012ac50;
    }
  }
  __ptr = (char *)0x0;
  __size = 0;
LAB_0012ac50:
  uVar4 = 0;
  do {
    if (__size < uVar4 + lVar5) {
      __size = __size + lVar5;
      __ptr = (char *)realloc(__ptr,__size);
    }
    sVar3 = fread(__ptr + uVar4,1,__size - uVar4,(FILE *)fp);
    uVar4 = uVar4 + sVar3;
    iVar2 = feof((FILE *)fp);
  } while ((iVar2 == 0) && ((bool)(uVar4 < (ulong)local_c0.st_size | bVar1)));
  *size = uVar4;
  return __ptr;
}

Assistant:

static char *mfload(FILE *fp, const char *fn, size_t *size, int binary) {
    struct stat sb;
    char *data = NULL;
    size_t allocated = 0, used = 0;
    int bufsize = 8192;

#ifdef _WIN32
    if (binary)
	_setmode(_fileno(fp), _O_BINARY);
    else 
	_setmode(_fileno(fp), _O_TEXT);
#endif

    if (fn && -1 != stat(fn, &sb)) {
	data = malloc(allocated = sb.st_size);
	bufsize = sb.st_size;
    } else {
	fn = NULL;
    }

    do {
	size_t len;
	if (used + bufsize > allocated) {
	    allocated += bufsize;
	    data = realloc(data, allocated);
	}
	len = fread(data + used, 1, allocated - used, fp);
	if (len > 0)
	    used += len;
    } while (!feof(fp) && (fn == NULL || used < sb.st_size));

    *size = used;

    return data;
}